

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::Decode
          (GED_BasicGroundCombatSoldier *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GED_BasicGroundCombatSoldier *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x14) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui16EntityID);
  pKVar2 = KDataStream::operator>>(pKVar2,this->m_i16Offsets);
  pKVar2 = KDataStream::operator>>(pKVar2,this->m_i16Offsets + 1);
  pKVar2 = KDataStream::operator>>(pKVar2,this->m_i16Offsets + 2);
  pKVar2 = operator>>(pKVar2,&(this->m_EA).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,this->m_i8Ori);
  pKVar2 = KDataStream::operator>>(pKVar2,this->m_i8Ori + 1);
  pKVar2 = KDataStream::operator>>(pKVar2,this->m_i8Ori + 2);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_i8Spd);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_i8HdAz);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_i8HdElv);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_i8HdScanRt);
  KDataStream::operator>>(pKVar2,&this->m_i8HdElvRt);
  return;
}

Assistant:

void GED_BasicGroundCombatSoldier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_BASIC_GROUND_COMBAT_SOLDIER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16EntityID
           >> m_i16Offsets[0]
           >> m_i16Offsets[1]
           >> m_i16Offsets[2]
           >> KDIS_STREAM m_EA
           >> m_i8Ori[0]
           >> m_i8Ori[1]
           >> m_i8Ori[2]
           >> m_i8Spd
           >> m_i8HdAz
           >> m_i8HdElv
           >> m_i8HdScanRt
           >> m_i8HdElvRt;
}